

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::CalculatePosition
          (SscReaderGeneric *this,BlockVecVec *bvv,RankPosMap *allRanks)

{
  __node_base *p_Var1;
  pointer pBVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  pointer pvVar5;
  long lVar6;
  pointer pvVar7;
  pointer pBVar8;
  RankPosMap *__range4;
  unsigned_long uVar9;
  int iVar10;
  __node_base *p_Var11;
  key_type local_34;
  
  local_34 = 0;
  pvVar5 = (bvv->
           super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (bvv->
           super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pvVar7 - (long)pvVar5) >> 3) * -0x55555555) {
    p_Var1 = &(allRanks->_M_h)._M_before_begin;
    uVar9 = 0;
    p_Var11 = p_Var1;
LAB_00146e71:
    do {
      p_Var11 = p_Var11->_M_nxt;
      if (p_Var11 != (__node_base *)0x0) {
        if ((int)*(size_type *)(p_Var11 + 1) != local_34) goto LAB_00146e71;
        pmVar3 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)allRanks,&local_34);
        pmVar3->first = uVar9;
        lVar6 = (long)local_34;
        pvVar5 = (bvv->
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = *(pointer *)
                  ((long)&pvVar5[lVar6].
                          super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (pBVar8 = pvVar5[lVar6].
                      super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start; pBVar8 != pBVar2;
            pBVar8 = pBVar8 + 1) {
          pBVar8->bufferStart = pBVar8->bufferStart + uVar9;
        }
        sVar4 = TotalDataSize(pvVar5 + lVar6);
        pmVar3 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)allRanks,&local_34);
        pmVar3->second = sVar4 + 1;
        uVar9 = uVar9 + sVar4 + 1;
        pvVar5 = (bvv->
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar7 = (bvv->
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      local_34 = local_34 + 1;
      iVar10 = (int)((ulong)((long)pvVar7 - (long)pvVar5) >> 3);
      p_Var11 = p_Var1;
    } while (SBORROW4(local_34,iVar10 * -0x55555555) != local_34 + iVar10 * 0x55555555 < 0);
  }
  return;
}

Assistant:

void SscReaderGeneric::CalculatePosition(ssc::BlockVecVec &bvv, ssc::RankPosMap &allRanks)
{

    size_t bufferPosition = 0;

    for (int rank = 0; rank < static_cast<int>(bvv.size()); ++rank)
    {
        bool hasOverlap = false;
        for (const auto &r : allRanks)
        {
            if (r.first == rank)
            {
                hasOverlap = true;
                break;
            }
        }
        if (hasOverlap)
        {
            allRanks[rank].first = bufferPosition;
            auto &bv = bvv[rank];
            for (auto &b : bv)
            {
                b.bufferStart += bufferPosition;
            }
            size_t currentRankTotalSize = ssc::TotalDataSize(bv);
            allRanks[rank].second = currentRankTotalSize + 1;
            bufferPosition += currentRankTotalSize + 1;
        }
    }
}